

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  type rollback;
  value_type *other;
  success<toml::detail::region> local_128;
  uint local_e0;
  failure_type local_d9;
  char *local_d8;
  undefined1 local_c0 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  size_t i;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  region retval;
  location *loc_local;
  
  region::region((region *)&first,loc);
  rollback = location::iter(loc);
  for (rslt.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
      (ulong)rslt.field_1.succ.value.last_._M_current < (char *)0x4;
      rslt.field_1.succ.value.last_._M_current =
           (const_iterator)((long)rslt.field_1.succ.value.last_._M_current + 1)) {
    in_range<'0',_'9'>::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_c0,loc);
    bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
    if (bVar1) {
      local_d8 = rollback._M_current;
      location::reset(loc,(const_iterator)rollback._M_current);
      none();
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_d9);
    }
    else {
      other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
      region::operator+=((region *)&first,other);
    }
    local_e0 = (uint)bVar1;
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_c0);
    if (local_e0 != 0) goto LAB_0016f66e;
  }
  ok<toml::detail::region>(&local_128,(region *)&first);
  result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_128);
  success<toml::detail::region>::~success(&local_128);
  local_e0 = 1;
LAB_0016f66e:
  region::~region((region *)&first);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);
        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        return ok(std::move(retval));
    }